

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

void embree::avx::DiscMiMBIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  float fVar31;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar57;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  float fVar67;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 in_ZMM15 [64];
  undefined1 auVar95 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  RTCFilterFunctionNArguments local_2f0;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar56 [64];
  
  pSVar6 = context->scene;
  uVar20 = Disc->sharedGeomID;
  pGVar7 = (pSVar6->geometries).items[uVar20].ptr;
  fVar1 = (pGVar7->time_range).lower;
  fVar1 = pGVar7->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar7->time_range).upper - fVar1));
  auVar88 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar88 = vminss_avx(auVar88,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar88 = vmaxss_avx(ZEXT816(0) << 0x20,auVar88);
  uVar22 = (ulong)(Disc->primIDs).field_0.i[0];
  lVar8 = *(long *)&pGVar7[2].numPrimitives;
  lVar25 = (long)(int)auVar88._0_4_ * 0x38;
  lVar9 = *(long *)(lVar8 + lVar25);
  lVar10 = *(long *)(lVar8 + 0x10 + lVar25);
  uVar30 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar26 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar27 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar24 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar41._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar24);
  auVar41._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar22);
  uVar28 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar45._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar28);
  auVar45._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar30);
  uVar29 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar49._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar29);
  auVar49._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar26);
  uVar21 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar50._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar21);
  auVar50._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar27);
  lVar9 = *(long *)(lVar8 + 0x38 + lVar25);
  lVar8 = *(long *)(lVar8 + 0x48 + lVar25);
  auVar52._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar24 * lVar8);
  auVar52._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar22 * lVar8);
  auVar54._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar28 * lVar8);
  auVar54._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar30 * lVar8);
  auVar58._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar29 * lVar8);
  auVar58._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar26 * lVar8);
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar21);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar27 * lVar8);
  fVar1 = fVar1 - auVar88._0_4_;
  auVar47 = vunpcklps_avx(auVar41,auVar49);
  auVar49 = vunpckhps_avx(auVar41,auVar49);
  auVar14 = vunpcklps_avx(auVar45,auVar50);
  auVar50 = vunpckhps_avx(auVar45,auVar50);
  auVar41 = vunpcklps_avx(auVar47,auVar14);
  auVar47 = vunpckhps_avx(auVar47,auVar14);
  auVar45 = vunpcklps_avx(auVar49,auVar50);
  auVar14 = vunpcklps_avx(auVar52,auVar58);
  auVar52 = vunpckhps_avx(auVar52,auVar58);
  auVar48 = vunpcklps_avx(auVar54,auVar68);
  auVar54 = vunpckhps_avx(auVar54,auVar68);
  auVar51 = vunpcklps_avx(auVar14,auVar48);
  auVar14 = vunpckhps_avx(auVar14,auVar48);
  auVar48 = vunpcklps_avx(auVar52,auVar54);
  auVar88 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar13 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  auVar86._8_4_ = 0x3f800000;
  auVar86._0_8_ = 0x3f8000003f800000;
  auVar86._12_4_ = 0x3f800000;
  auVar86._16_4_ = 0x3f800000;
  auVar86._20_4_ = 0x3f800000;
  auVar86._24_4_ = 0x3f800000;
  auVar86._28_4_ = 0x3f800000;
  fVar12 = auVar88._0_4_;
  fVar38 = auVar88._4_4_;
  fVar39 = auVar88._8_4_;
  fVar36 = auVar88._12_4_;
  fVar37 = auVar13._0_4_;
  fVar76 = auVar13._4_4_;
  fVar77 = auVar13._8_4_;
  fVar78 = auVar13._12_4_;
  auVar46._0_4_ = auVar51._0_4_ * fVar12 + fVar37 * auVar41._0_4_;
  auVar46._4_4_ = auVar51._4_4_ * fVar38 + fVar76 * auVar41._4_4_;
  auVar46._8_4_ = auVar51._8_4_ * fVar39 + fVar77 * auVar41._8_4_;
  auVar46._12_4_ = auVar51._12_4_ * fVar36 + fVar78 * auVar41._12_4_;
  auVar46._16_4_ = auVar51._16_4_ * fVar12 + fVar37 * auVar41._16_4_;
  auVar46._20_4_ = auVar51._20_4_ * fVar38 + fVar76 * auVar41._20_4_;
  auVar46._24_4_ = auVar51._24_4_ * fVar39 + fVar77 * auVar41._24_4_;
  auVar46._28_4_ = auVar51._28_4_ + auVar41._28_4_;
  auVar51._0_4_ = fVar37 * auVar47._0_4_ + fVar12 * auVar14._0_4_;
  auVar51._4_4_ = fVar76 * auVar47._4_4_ + fVar38 * auVar14._4_4_;
  auVar51._8_4_ = fVar77 * auVar47._8_4_ + fVar39 * auVar14._8_4_;
  auVar51._12_4_ = fVar78 * auVar47._12_4_ + fVar36 * auVar14._12_4_;
  auVar51._16_4_ = fVar37 * auVar47._16_4_ + fVar12 * auVar14._16_4_;
  auVar51._20_4_ = fVar76 * auVar47._20_4_ + fVar38 * auVar14._20_4_;
  auVar51._24_4_ = fVar77 * auVar47._24_4_ + fVar39 * auVar14._24_4_;
  auVar51._28_4_ = auVar47._28_4_ + auVar14._28_4_;
  local_250 = vshufps_avx(ZEXT416(uVar20),ZEXT416(uVar20),0);
  local_260 = local_250;
  uVar2 = *(undefined4 *)(ray + k * 4);
  auVar59._4_4_ = uVar2;
  auVar59._0_4_ = uVar2;
  auVar59._8_4_ = uVar2;
  auVar59._12_4_ = uVar2;
  auVar59._16_4_ = uVar2;
  auVar59._20_4_ = uVar2;
  auVar59._24_4_ = uVar2;
  auVar59._28_4_ = uVar2;
  auVar53._0_4_ = auVar48._0_4_ * fVar12 + fVar37 * auVar45._0_4_;
  auVar53._4_4_ = auVar48._4_4_ * fVar38 + fVar76 * auVar45._4_4_;
  auVar53._8_4_ = auVar48._8_4_ * fVar39 + fVar77 * auVar45._8_4_;
  auVar53._12_4_ = auVar48._12_4_ * fVar36 + fVar78 * auVar45._12_4_;
  auVar53._16_4_ = auVar48._16_4_ * fVar12 + fVar37 * auVar45._16_4_;
  auVar53._20_4_ = auVar48._20_4_ * fVar38 + fVar76 * auVar45._20_4_;
  auVar53._24_4_ = auVar48._24_4_ * fVar39 + fVar77 * auVar45._24_4_;
  auVar53._28_4_ = auVar48._28_4_ + auVar14._28_4_;
  auVar41 = vsubps_avx(auVar46,auVar59);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar47._4_4_ = uVar2;
  auVar47._0_4_ = uVar2;
  auVar47._8_4_ = uVar2;
  auVar47._12_4_ = uVar2;
  auVar47._16_4_ = uVar2;
  auVar47._20_4_ = uVar2;
  auVar47._24_4_ = uVar2;
  auVar47._28_4_ = uVar2;
  auVar45 = vsubps_avx(auVar51,auVar47);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar48._4_4_ = uVar2;
  auVar48._0_4_ = uVar2;
  auVar48._8_4_ = uVar2;
  auVar48._12_4_ = uVar2;
  auVar48._16_4_ = uVar2;
  auVar48._20_4_ = uVar2;
  auVar48._24_4_ = uVar2;
  auVar48._28_4_ = uVar2;
  auVar48 = vsubps_avx(auVar53,auVar48);
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  fVar3 = *(float *)(ray + k * 4 + 0xa0);
  fVar4 = *(float *)(ray + k * 4 + 0xc0);
  auVar88 = ZEXT416((uint)(fVar1 * fVar1 + fVar3 * fVar3 + fVar4 * fVar4));
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar89._16_16_ = auVar88;
  auVar89._0_16_ = auVar88;
  auVar47 = vrcpps_avx(auVar89);
  fVar31 = auVar47._0_4_;
  fVar34 = auVar47._4_4_;
  auVar14._4_4_ = fVar34 * auVar88._4_4_;
  auVar14._0_4_ = fVar31 * auVar88._0_4_;
  fVar35 = auVar47._8_4_;
  auVar14._8_4_ = fVar35 * auVar88._8_4_;
  fVar91 = auVar47._12_4_;
  auVar14._12_4_ = fVar91 * auVar88._12_4_;
  fVar92 = auVar47._16_4_;
  auVar14._16_4_ = fVar92 * auVar88._0_4_;
  fVar93 = auVar47._20_4_;
  auVar14._20_4_ = fVar93 * auVar88._4_4_;
  fVar94 = auVar47._24_4_;
  auVar14._24_4_ = fVar94 * auVar88._8_4_;
  auVar14._28_4_ = auVar88._12_4_;
  auVar47 = vsubps_avx(auVar86,auVar14);
  fVar79 = auVar48._0_4_;
  fVar80 = auVar48._4_4_;
  fVar81 = auVar48._8_4_;
  fVar82 = auVar48._12_4_;
  fVar83 = auVar48._16_4_;
  fVar84 = auVar48._20_4_;
  fVar85 = auVar48._24_4_;
  fVar67 = auVar45._0_4_;
  fVar70 = auVar45._4_4_;
  fVar71 = auVar45._8_4_;
  fVar72 = auVar45._12_4_;
  fVar73 = auVar45._16_4_;
  fVar74 = auVar45._20_4_;
  fVar75 = auVar45._24_4_;
  fVar57 = auVar41._0_4_;
  fVar61 = auVar41._4_4_;
  fVar62 = auVar41._8_4_;
  fVar63 = auVar41._12_4_;
  fVar64 = auVar41._16_4_;
  fVar65 = auVar41._20_4_;
  fVar66 = auVar41._24_4_;
  auVar56._0_4_ =
       (fVar57 * fVar1 + fVar67 * fVar3 + fVar79 * fVar4) * (fVar31 + fVar31 * auVar47._0_4_);
  auVar56._4_4_ =
       (fVar61 * fVar1 + fVar70 * fVar3 + fVar80 * fVar4) * (fVar34 + fVar34 * auVar47._4_4_);
  auVar56._8_4_ =
       (fVar62 * fVar1 + fVar71 * fVar3 + fVar81 * fVar4) * (fVar35 + fVar35 * auVar47._8_4_);
  auVar56._12_4_ =
       (fVar63 * fVar1 + fVar72 * fVar3 + fVar82 * fVar4) * (fVar91 + fVar91 * auVar47._12_4_);
  auVar56._16_4_ =
       (fVar64 * fVar1 + fVar73 * fVar3 + fVar83 * fVar4) * (fVar92 + fVar92 * auVar47._16_4_);
  auVar56._20_4_ =
       (fVar65 * fVar1 + fVar74 * fVar3 + fVar84 * fVar4) * (fVar93 + fVar93 * auVar47._20_4_);
  auVar56._28_36_ = in_ZMM15._28_36_;
  auVar56._24_4_ =
       (fVar66 * fVar1 + fVar75 * fVar3 + fVar85 * fVar4) * (fVar94 + fVar94 * auVar47._24_4_);
  local_200 = auVar56._0_32_;
  auVar95 = ZEXT3264(local_200);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar87._4_4_ = uVar2;
  auVar87._0_4_ = uVar2;
  auVar87._8_4_ = uVar2;
  auVar87._12_4_ = uVar2;
  auVar87._16_4_ = uVar2;
  auVar87._20_4_ = uVar2;
  auVar87._24_4_ = uVar2;
  auVar87._28_4_ = uVar2;
  auVar47 = vcmpps_avx(auVar87,local_200,2);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
  local_2a0._4_4_ = uVar2;
  local_2a0._0_4_ = uVar2;
  local_2a0._8_4_ = uVar2;
  local_2a0._12_4_ = uVar2;
  local_2a0._16_4_ = uVar2;
  local_2a0._20_4_ = uVar2;
  local_2a0._24_4_ = uVar2;
  local_2a0._28_4_ = uVar2;
  auVar14 = vcmpps_avx(local_200,local_2a0,2);
  auVar47 = vandps_avx(auVar47,auVar14);
  auVar88 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar90._16_16_ = auVar88;
  auVar90._0_16_ = auVar88;
  auVar14 = vcvtdq2ps_avx(auVar90);
  auVar14 = vcmpps_avx(_DAT_01f7b060,auVar14,1);
  auVar51 = auVar14 & auVar47;
  if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar51 >> 0x7f,0) != '\0') ||
        (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar51 >> 0xbf,0) != '\0') ||
      (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar51[0x1f] < '\0') {
    auVar47 = vandps_avx(auVar47,auVar14);
    auVar14 = vunpckhps_avx(auVar49,auVar50);
    auVar49 = vunpckhps_avx(auVar52,auVar54);
    fVar31 = fVar37 * auVar14._0_4_ + fVar12 * auVar49._0_4_;
    fVar34 = fVar76 * auVar14._4_4_ + fVar38 * auVar49._4_4_;
    fVar35 = fVar77 * auVar14._8_4_ + fVar39 * auVar49._8_4_;
    fVar36 = fVar78 * auVar14._12_4_ + fVar36 * auVar49._12_4_;
    fVar37 = fVar37 * auVar14._16_4_ + fVar12 * auVar49._16_4_;
    fVar38 = fVar76 * auVar14._20_4_ + fVar38 * auVar49._20_4_;
    fVar39 = fVar77 * auVar14._24_4_ + fVar39 * auVar49._24_4_;
    auVar15._4_4_ = auVar56._4_4_ * fVar1;
    auVar15._0_4_ = auVar56._0_4_ * fVar1;
    auVar15._8_4_ = auVar56._8_4_ * fVar1;
    auVar15._12_4_ = auVar56._12_4_ * fVar1;
    auVar15._16_4_ = auVar56._16_4_ * fVar1;
    auVar15._20_4_ = auVar56._20_4_ * fVar1;
    auVar15._24_4_ = auVar56._24_4_ * fVar1;
    auVar15._28_4_ = auVar49._28_4_;
    auVar16._4_4_ = auVar56._4_4_ * fVar3;
    auVar16._0_4_ = auVar56._0_4_ * fVar3;
    auVar16._8_4_ = auVar56._8_4_ * fVar3;
    auVar16._12_4_ = auVar56._12_4_ * fVar3;
    auVar16._16_4_ = auVar56._16_4_ * fVar3;
    auVar16._20_4_ = auVar56._20_4_ * fVar3;
    auVar16._24_4_ = auVar56._24_4_ * fVar3;
    auVar16._28_4_ = auVar52._28_4_;
    auVar17._4_4_ = auVar56._4_4_ * fVar4;
    auVar17._0_4_ = auVar56._0_4_ * fVar4;
    auVar17._8_4_ = auVar56._8_4_ * fVar4;
    auVar17._12_4_ = auVar56._12_4_ * fVar4;
    auVar17._16_4_ = auVar56._16_4_ * fVar4;
    auVar17._20_4_ = auVar56._20_4_ * fVar4;
    auVar17._24_4_ = auVar56._24_4_ * fVar4;
    auVar17._28_4_ = auVar54._28_4_;
    auVar14 = vsubps_avx(auVar41,auVar15);
    auVar45 = vsubps_avx(auVar45,auVar16);
    auVar48 = vsubps_avx(auVar48,auVar17);
    fVar12 = auVar48._28_4_;
    auVar42._0_4_ =
         auVar14._0_4_ * auVar14._0_4_ +
         auVar45._0_4_ * auVar45._0_4_ + auVar48._0_4_ * auVar48._0_4_;
    auVar42._4_4_ =
         auVar14._4_4_ * auVar14._4_4_ +
         auVar45._4_4_ * auVar45._4_4_ + auVar48._4_4_ * auVar48._4_4_;
    auVar42._8_4_ =
         auVar14._8_4_ * auVar14._8_4_ +
         auVar45._8_4_ * auVar45._8_4_ + auVar48._8_4_ * auVar48._8_4_;
    auVar42._12_4_ =
         auVar14._12_4_ * auVar14._12_4_ +
         auVar45._12_4_ * auVar45._12_4_ + auVar48._12_4_ * auVar48._12_4_;
    auVar42._16_4_ =
         auVar14._16_4_ * auVar14._16_4_ +
         auVar45._16_4_ * auVar45._16_4_ + auVar48._16_4_ * auVar48._16_4_;
    auVar42._20_4_ =
         auVar14._20_4_ * auVar14._20_4_ +
         auVar45._20_4_ * auVar45._20_4_ + auVar48._20_4_ * auVar48._20_4_;
    auVar42._24_4_ =
         auVar14._24_4_ * auVar14._24_4_ +
         auVar45._24_4_ * auVar45._24_4_ + auVar48._24_4_ * auVar48._24_4_;
    auVar42._28_4_ = auVar14._28_4_ + auVar45._28_4_ + fVar12;
    auVar18._4_4_ = fVar34 * fVar34;
    auVar18._0_4_ = fVar31 * fVar31;
    auVar18._8_4_ = fVar35 * fVar35;
    auVar18._12_4_ = fVar36 * fVar36;
    auVar18._16_4_ = fVar37 * fVar37;
    auVar18._20_4_ = fVar38 * fVar38;
    auVar18._24_4_ = fVar39 * fVar39;
    auVar18._28_4_ = auVar14._28_4_;
    auVar14 = vcmpps_avx(auVar42,auVar18,2);
    auVar45 = auVar47 & auVar14;
    if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar45 >> 0x7f,0) != '\0') ||
          (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar45 >> 0xbf,0) != '\0') ||
        (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar45[0x1f] < '\0')
    {
      auVar47 = vandps_avx(auVar47,auVar14);
      auVar43._0_4_ = fVar57 * fVar57 + fVar67 * fVar67 + fVar79 * fVar79;
      auVar43._4_4_ = fVar61 * fVar61 + fVar70 * fVar70 + fVar80 * fVar80;
      auVar43._8_4_ = fVar62 * fVar62 + fVar71 * fVar71 + fVar81 * fVar81;
      auVar43._12_4_ = fVar63 * fVar63 + fVar72 * fVar72 + fVar82 * fVar82;
      auVar43._16_4_ = fVar64 * fVar64 + fVar73 * fVar73 + fVar83 * fVar83;
      auVar43._20_4_ = fVar65 * fVar65 + fVar74 * fVar74 + fVar84 * fVar84;
      auVar43._24_4_ = fVar66 * fVar66 + fVar75 * fVar75 + fVar85 * fVar85;
      auVar43._28_4_ = fVar12 + fVar12 + auVar42._28_4_;
      auVar14 = vcmpps_avx(auVar43,auVar18,6);
      auVar45 = auVar47 & auVar14;
      if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar45 >> 0x7f,0) != '\0') ||
            (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar45 >> 0xbf,0) != '\0') ||
          (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar45[0x1f] < '\0') {
        local_2c0 = vandps_avx(auVar14,auVar47);
        local_220 = ZEXT1232(ZEXT412(0)) << 0x20;
        local_240 = ZEXT1232(ZEXT412(0)) << 0x20;
        local_1e0[0] = -fVar1;
        local_1e0[1] = -fVar1;
        local_1e0[2] = -fVar1;
        local_1e0[3] = -fVar1;
        fStack_1d0 = -fVar1;
        fStack_1cc = -fVar1;
        fStack_1c8 = -fVar1;
        fStack_1c4 = -fVar1;
        local_1c0[0] = -fVar3;
        local_1c0[1] = -fVar3;
        local_1c0[2] = -fVar3;
        local_1c0[3] = -fVar3;
        fStack_1b0 = -fVar3;
        fStack_1ac = -fVar3;
        fStack_1a8 = -fVar3;
        fStack_1a4 = -fVar3;
        local_1a0[0] = -fVar4;
        local_1a0[1] = -fVar4;
        local_1a0[2] = -fVar4;
        local_1a0[3] = -fVar4;
        fStack_190 = -fVar4;
        fStack_18c = -fVar4;
        fStack_188 = -fVar4;
        fStack_184 = -fVar4;
        auVar55._8_4_ = 0x7f800000;
        auVar55._0_8_ = 0x7f8000007f800000;
        auVar55._12_4_ = 0x7f800000;
        auVar55._16_4_ = 0x7f800000;
        auVar55._20_4_ = 0x7f800000;
        auVar55._24_4_ = 0x7f800000;
        auVar55._28_4_ = 0x7f800000;
        auVar56 = ZEXT3264(auVar55);
        auVar47 = vblendvps_avx(auVar55,local_200,local_2c0);
        auVar14 = vshufps_avx(auVar47,auVar47,0xb1);
        auVar14 = vminps_avx(auVar47,auVar14);
        auVar45 = vshufpd_avx(auVar14,auVar14,5);
        auVar14 = vminps_avx(auVar14,auVar45);
        auVar45 = vperm2f128_avx(auVar14,auVar14,1);
        auVar14 = vminps_avx(auVar14,auVar45);
        auVar14 = vcmpps_avx(auVar47,auVar14,0);
        auVar45 = local_2c0 & auVar14;
        auVar47 = local_2c0;
        if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar45 >> 0x7f,0) != '\0') ||
              (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar45 >> 0xbf,0) != '\0') ||
            (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar45[0x1f] < '\0') {
          auVar47 = vandps_avx(auVar14,local_2c0);
        }
        uVar19 = vmovmskps_avx(auVar47);
        uVar23 = 1 << ((byte)k & 0x1f);
        uVar20 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        auVar47 = vcmpps_avx(auVar41,auVar41,0xf);
        auVar60 = ZEXT3264(auVar47);
        auVar69 = ZEXT864(0) << 0x20;
        do {
          local_2f0.hit = local_180;
          local_2f0.valid = (int *)local_320;
          uVar21 = (ulong)uVar20;
          uVar20 = *(uint *)(local_260 + uVar21 * 4);
          pGVar7 = (pSVar6->geometries).items[uVar20].ptr;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            *(undefined4 *)(local_2c0 + uVar21 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar2 = *(undefined4 *)(local_240 + uVar21 * 4);
              uVar5 = *(undefined4 *)(local_220 + uVar21 * 4);
              *(float *)(ray + k * 4 + 0x100) = local_1e0[uVar21 - 8];
              *(float *)(ray + k * 4 + 0x180) = local_1e0[uVar21];
              *(float *)(ray + k * 4 + 0x1a0) = local_1c0[uVar21];
              *(float *)(ray + k * 4 + 0x1c0) = local_1a0[uVar21];
              *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar2;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar5;
              *(uint *)(ray + k * 4 + 0x220) = (Disc->primIDs).field_0.i[uVar21];
              *(uint *)(ray + k * 4 + 0x240) = uVar20;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              return;
            }
            local_120 = *(undefined4 *)(local_240 + uVar21 * 4);
            local_100 = *(undefined4 *)(local_220 + uVar21 * 4);
            auStack_b0 = vpshufd_avx(ZEXT416(uVar20),0);
            local_e0 = (Disc->primIDs).field_0.i[uVar21];
            fVar1 = local_1e0[uVar21];
            fVar3 = local_1c0[uVar21];
            local_160._4_4_ = fVar3;
            local_160._0_4_ = fVar3;
            local_160._8_4_ = fVar3;
            local_160._12_4_ = fVar3;
            local_160._16_4_ = fVar3;
            local_160._20_4_ = fVar3;
            local_160._24_4_ = fVar3;
            local_160._28_4_ = fVar3;
            fVar3 = local_1a0[uVar21];
            local_140._4_4_ = fVar3;
            local_140._0_4_ = fVar3;
            local_140._8_4_ = fVar3;
            local_140._12_4_ = fVar3;
            local_140._16_4_ = fVar3;
            local_140._20_4_ = fVar3;
            local_140._24_4_ = fVar3;
            local_140._28_4_ = fVar3;
            local_180[0] = (RTCHitN)SUB41(fVar1,0);
            local_180[1] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[2] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[3] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[4] = (RTCHitN)SUB41(fVar1,0);
            local_180[5] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[6] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[7] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[8] = (RTCHitN)SUB41(fVar1,0);
            local_180[9] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[10] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0xb] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0xc] = (RTCHitN)SUB41(fVar1,0);
            local_180[0xd] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0xe] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0xf] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x10] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x11] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x12] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x13] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x14] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x15] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x16] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x17] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x18] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x19] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x1a] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x1b] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x1c] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x1d] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x1e] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x1f] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            uStack_11c = local_120;
            uStack_118 = local_120;
            uStack_114 = local_120;
            uStack_110 = local_120;
            uStack_10c = local_120;
            uStack_108 = local_120;
            uStack_104 = local_120;
            uStack_fc = local_100;
            uStack_f8 = local_100;
            uStack_f4 = local_100;
            uStack_f0 = local_100;
            uStack_ec = local_100;
            uStack_e8 = local_100;
            uStack_e4 = local_100;
            uStack_dc = local_e0;
            uStack_d8 = local_e0;
            uStack_d4 = local_e0;
            uStack_d0 = local_e0;
            uStack_cc = local_e0;
            uStack_c8 = local_e0;
            uStack_c4 = local_e0;
            local_c0 = auStack_b0;
            uStack_9c = context->user->instID[0];
            local_a0 = uStack_9c;
            uStack_98 = uStack_9c;
            uStack_94 = uStack_9c;
            uStack_90 = uStack_9c;
            uStack_8c = uStack_9c;
            uStack_88 = uStack_9c;
            uStack_84 = uStack_9c;
            uStack_7c = context->user->instPrimID[0];
            local_80 = uStack_7c;
            uStack_78 = uStack_7c;
            uStack_74 = uStack_7c;
            uStack_70 = uStack_7c;
            uStack_6c = uStack_7c;
            uStack_68 = uStack_7c;
            uStack_64 = uStack_7c;
            *(float *)(ray + k * 4 + 0x100) = local_1e0[uVar21 - 8];
            local_320 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar23 & 0xf) << 4));
            local_310 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar23 >> 4) * 0x10);
            local_2f0.geometryUserPtr = pGVar7->userPtr;
            local_2f0.context = context->user;
            local_2f0.N = 8;
            local_2f0.ray = (RTCRayN *)ray;
            if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              local_280 = auVar95._0_32_;
              auVar47 = ZEXT1632(auVar60._0_16_);
              (*pGVar7->intersectionFilterN)(&local_2f0);
              auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar47 = vcmpps_avx(auVar47,auVar47,0xf);
              auVar60 = ZEXT3264(auVar47);
              auVar56 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar95 = ZEXT3264(local_280);
            }
            auVar88 = vpcmpeqd_avx(auVar69._0_16_,local_320);
            auVar13 = vpcmpeqd_avx(auVar69._0_16_,local_310);
            auVar44._16_16_ = auVar13;
            auVar44._0_16_ = auVar88;
            auVar47 = auVar60._0_32_ & ~auVar44;
            if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar47 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar47 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar47 >> 0x7f,0) == '\0') &&
                  (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar47 >> 0xbf,0) == '\0') &&
                (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar47[0x1f]) {
              auVar32._0_4_ = auVar60._0_4_ ^ auVar88._0_4_;
              auVar32._4_4_ = auVar60._4_4_ ^ auVar88._4_4_;
              auVar32._8_4_ = auVar60._8_4_ ^ auVar88._8_4_;
              auVar32._12_4_ = auVar60._12_4_ ^ auVar88._12_4_;
              auVar32._16_4_ = auVar60._16_4_ ^ auVar13._0_4_;
              auVar32._20_4_ = auVar60._20_4_ ^ auVar13._4_4_;
              auVar32._24_4_ = auVar60._24_4_ ^ auVar13._8_4_;
              auVar32._28_4_ = auVar60._28_4_ ^ auVar13._12_4_;
            }
            else {
              p_Var11 = context->args->filter;
              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                local_280 = auVar95._0_32_;
                auVar47 = ZEXT1632(auVar60._0_16_);
                (*p_Var11)(&local_2f0);
                auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar47 = vcmpps_avx(auVar47,auVar47,0xf);
                auVar60 = ZEXT3264(auVar47);
                auVar56 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar95 = ZEXT3264(local_280);
              }
              auVar88 = vpcmpeqd_avx(auVar69._0_16_,local_320);
              auVar13 = vpcmpeqd_avx(auVar69._0_16_,local_310);
              auVar40._16_16_ = auVar13;
              auVar40._0_16_ = auVar88;
              auVar32._0_4_ = auVar60._0_4_ ^ auVar88._0_4_;
              auVar32._4_4_ = auVar60._4_4_ ^ auVar88._4_4_;
              auVar32._8_4_ = auVar60._8_4_ ^ auVar88._8_4_;
              auVar32._12_4_ = auVar60._12_4_ ^ auVar88._12_4_;
              auVar32._16_4_ = auVar60._16_4_ ^ auVar13._0_4_;
              auVar32._20_4_ = auVar60._20_4_ ^ auVar13._4_4_;
              auVar32._24_4_ = auVar60._24_4_ ^ auVar13._8_4_;
              auVar32._28_4_ = auVar60._28_4_ ^ auVar13._12_4_;
              auVar47 = auVar60._0_32_ & ~auVar40;
              if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar47 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar47 >> 0x7f,0) != '\0') ||
                    (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar47 >> 0xbf,0) != '\0') ||
                  (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar47[0x1f] < '\0') {
                auVar47 = vmaskmovps_avx(auVar32,*(undefined1 (*) [32])local_2f0.hit);
                *(undefined1 (*) [32])(local_2f0.ray + 0x180) = auVar47;
                auVar47 = vmaskmovps_avx(auVar32,*(undefined1 (*) [32])(local_2f0.hit + 0x20));
                *(undefined1 (*) [32])(local_2f0.ray + 0x1a0) = auVar47;
                auVar47 = vmaskmovps_avx(auVar32,*(undefined1 (*) [32])(local_2f0.hit + 0x40));
                *(undefined1 (*) [32])(local_2f0.ray + 0x1c0) = auVar47;
                auVar47 = vmaskmovps_avx(auVar32,*(undefined1 (*) [32])(local_2f0.hit + 0x60));
                *(undefined1 (*) [32])(local_2f0.ray + 0x1e0) = auVar47;
                auVar47 = vmaskmovps_avx(auVar32,*(undefined1 (*) [32])(local_2f0.hit + 0x80));
                *(undefined1 (*) [32])(local_2f0.ray + 0x200) = auVar47;
                auVar47 = vmaskmovps_avx(auVar32,*(undefined1 (*) [32])(local_2f0.hit + 0xa0));
                *(undefined1 (*) [32])(local_2f0.ray + 0x220) = auVar47;
                auVar47 = vmaskmovps_avx(auVar32,*(undefined1 (*) [32])(local_2f0.hit + 0xc0));
                *(undefined1 (*) [32])(local_2f0.ray + 0x240) = auVar47;
                auVar47 = vmaskmovps_avx(auVar32,*(undefined1 (*) [32])(local_2f0.hit + 0xe0));
                *(undefined1 (*) [32])(local_2f0.ray + 0x260) = auVar47;
                auVar47 = vmaskmovps_avx(auVar32,*(undefined1 (*) [32])(local_2f0.hit + 0x100));
                *(undefined1 (*) [32])(local_2f0.ray + 0x280) = auVar47;
              }
            }
            if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar32 >> 0x7f,0) == '\0') &&
                  (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar32 >> 0xbf,0) == '\0') &&
                (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar32[0x1f]) {
              *(int *)(ray + k * 4 + 0x100) = local_2a0._0_4_;
              auVar47 = local_2a0;
            }
            else {
              auVar47 = ZEXT432(*(uint *)(ray + k * 4 + 0x100));
            }
            *(undefined4 *)(local_2c0 + uVar21 * 4) = 0;
            auVar88 = vshufps_avx(auVar47._0_16_,auVar47._0_16_,0);
            auVar33._16_16_ = auVar88;
            auVar33._0_16_ = auVar88;
            auVar14 = vcmpps_avx(auVar95._0_32_,auVar33,2);
            local_2c0 = vandps_avx(auVar14,local_2c0);
            local_2a0 = auVar47;
          }
          if ((((((((local_2c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_2c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_2c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_2c0 >> 0x7f,0) == '\0') &&
                (local_2c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_2c0 >> 0xbf,0) == '\0') &&
              (local_2c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_2c0[0x1f]) {
            return;
          }
          auVar47 = vblendvps_avx(auVar56._0_32_,auVar95._0_32_,local_2c0);
          auVar14 = vshufps_avx(auVar47,auVar47,0xb1);
          auVar14 = vminps_avx(auVar47,auVar14);
          auVar41 = vshufpd_avx(auVar14,auVar14,5);
          auVar14 = vminps_avx(auVar14,auVar41);
          auVar41 = vperm2f128_avx(auVar14,auVar14,1);
          auVar14 = vminps_avx(auVar14,auVar41);
          auVar14 = vcmpps_avx(auVar47,auVar14,0);
          auVar41 = local_2c0 & auVar14;
          auVar47 = local_2c0;
          if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar41 >> 0x7f,0) != '\0') ||
                (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar41 >> 0xbf,0) != '\0') ||
              (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar41[0x1f] < '\0') {
            auVar47 = vandps_avx(auVar14,local_2c0);
          }
          uVar19 = vmovmskps_avx(auVar47);
          uVar20 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }